

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

boolean process_restart(j_decompress_ptr cinfo)

{
  uint *puVar1;
  int iVar2;
  jpeg_marker_reader *pjVar3;
  jpeg_entropy_decoder *pjVar4;
  boolean bVar5;
  long lVar6;
  int iVar7;
  
  pjVar3 = cinfo->marker;
  pjVar4 = cinfo->entropy;
  iVar2 = *(int *)&pjVar4[1].decode_mcu;
  iVar7 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar7 = iVar2;
  }
  puVar1 = &pjVar3->discarded_bytes;
  *puVar1 = *puVar1 + (iVar7 >> 3);
  *(undefined4 *)&pjVar4[1].decode_mcu = 0;
  bVar5 = (*pjVar3->read_restart_marker)(cinfo);
  if (bVar5 == 0) {
    bVar5 = 0;
  }
  else {
    if (0 < cinfo->comps_in_scan) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&pjVar4[2].start_pass + lVar6 * 4 + 4) = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 < cinfo->comps_in_scan);
    }
    *(undefined4 *)&pjVar4[2].start_pass = 0;
    *(uint *)&pjVar4[3].decode_mcu = cinfo->restart_interval;
    bVar5 = 1;
    if (cinfo->unread_marker == 0) {
      *(undefined4 *)((long)&pjVar4[3].start_pass + 4) = 0;
    }
  }
  return bVar5;
}

Assistant:

LOCAL(boolean)
process_restart (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->insufficient_data = FALSE;

  return TRUE;
}